

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O1

void sysbvm_type_setupPrimitives(sysbvm_context_t *context)

{
  sysbvm_tuple_t *psVar1;
  sysbvm_tuple_t sVar2;
  ulong immediateTypeTag;
  
  sVar2 = sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
                    (context,"SimpleFunctionTypeTemplate",4,0x60c,(void *)0x0,
                     sysbvm_type_primitive_createSimpleFunctionType);
  (context->roots).simpleFunctionTypeTemplate = sVar2;
  sVar2 = sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
                    (context,"SequenceTupleTypeTemplate",2,0x60c,(void *)0x0,
                     sysbvm_type_primitive_createSequenceTupleTemplate);
  (context->roots).sequenceTupleTypeTemplate = sVar2;
  sVar2 = sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
                    (context,"PointerTypeTemplate",3,0x60c,(void *)0x0,
                     sysbvm_type_primitive_createPointerType);
  (context->roots).pointerTypeTemplate = sVar2;
  sVar2 = sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
                    (context,"ReferenceTypeTemplate",3,0x60c,(void *)0x0,
                     sysbvm_type_primitive_createReferenceType);
  (context->roots).referenceTypeTemplate = sVar2;
  sVar2 = sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
                    (context,"TemporaryReferenceTypeTemplate",3,0x60c,(void *)0x0,
                     sysbvm_type_primitive_createTemporaryReferenceType);
  (context->roots).temporaryReferenceTypeTemplate = sVar2;
  sVar2 = sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
                    (context,"PointerLikeType::load",1,0x80004,(void *)0x0,
                     sysbvm_type_primitive_pointerLikeLoad);
  (context->roots).pointerLikeLoadPrimitive = sVar2;
  sVar2 = sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
                    (context,"PointerLikeType::store:",2,0x80004,(void *)0x0,
                     sysbvm_type_primitive_pointerLikeStore);
  (context->roots).pointerLikeStorePrimitive = sVar2;
  sVar2 = sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
                    (context,"PointerLikeType::at:",2,0x80004,(void *)0x0,
                     sysbvm_type_primitive_pointerLikeTypeElementAt);
  (context->roots).pointerLikeElementAt = sVar2;
  sVar2 = sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
                    (context,"PointerLikeType::reinterpretCast",1,0x80004,(void *)0x0,
                     sysbvm_type_primitive_pointerLikeTypeReinterpretCast);
  (context->roots).pointerLikeReinterpretCast = sVar2;
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"PointerType::reinterpretCastTo:",(context->roots).anyPointerType,
             "reinterpretCastTo:",2,4,(void *)0x0,
             sysbvm_type_primitive_pointerLikeTypeReinterpretCastTo);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"UIntPointer::reinterpretCastTo:",(context->roots).uintptrType,
             "reinterpretCastTo:",2,4,(void *)0x0,
             sysbvm_type_primitive_pointerLikeTypeReinterpretCastTo);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"IntPointer::reinterpretCastTo:",(context->roots).intptrType,
             "reinterpretCastTo:",2,4,(void *)0x0,
             sysbvm_type_primitive_pointerLikeTypeReinterpretCastTo);
  sVar2 = sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
                    (context,"Void::fromAnyValue",1,0x804,(void *)0x0,
                     sysbvm_void_primitive_anyValueToVoid);
  (context->roots).anyValueToVoidPrimitive = sVar2;
  psVar1 = (sysbvm_tuple_t *)(context->roots).voidType;
  immediateTypeTag = (ulong)psVar1 & 0xf;
  if (immediateTypeTag == 0 && psVar1 != (sysbvm_tuple_t *)0x0) {
    sVar2 = *psVar1;
  }
  else if ((int)immediateTypeTag == 0xf) {
    sVar2 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)psVar1 >> 4);
  }
  else {
    sVar2 = sysbvm_tuple_getImmediateTypeWithTag(context,immediateTypeTag);
  }
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,sVar2,"coerceASTNode:withEnvironment:",3,0,(void *)0x0,
             sysbvm_void_primitive_coerceASTNodeWithEnvironment);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).typeType,"coerceASTNode:withEnvironment:",3,0,(void *)0x0,
             sysbvm_type_primitive_coerceASTNodeWithEnvironment);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).typeType,"flushLookupSelector:",2,4,(void *)0x0,
             sysbvm_type_primitive_flushLookupSelector);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).typeType,"flushMacroLookupSelector:",2,4,(void *)0x0,
             sysbvm_type_primitive_flushMacroLookupSelector);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).typeType,"flushFallbackLookupSelector:",2,4,(void *)0x0,
             sysbvm_type_primitive_flushFallbackLookupSelector);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"TypeFlags::None",0xb);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"TypeFlags::Nullable",0x1b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"TypeFlags::Bytes",0x2b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"TypeFlags::Immediate",0x4b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"TypeFlags::Weak",0x8b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"TypeFlags::Final",0x10b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"TypeFlags::Abstract",0x20b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"TypeFlags::Dynamic",0x40b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"TypeFlags::Value",0x80b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"TypeFlags::FatPointerValue",0x100b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"TypeFlags::PointerValue",0x200b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"TypeFlags::ReferenceValue",0x400b)
  ;
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"TypeFlags::TemporaryReferenceValue",0x800b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"TypeFlags::Function",0x1000b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"TypeFlags::EmptyTrivialSingleton",0x2000b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"TypeFlags::PointerLikeValue",0xe00b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"TypeFlags::ClassDefaultFlags",0x1b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"TypeFlags::MetatypeRequiredFlags",0x1b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"TypeFlags::PointerTypeFlags",0x291b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"TypeFlags::ReferenceTypeFlags",0x490b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"TypeFlags::TemporaryReferenceTypeFlags",0x890b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"TypeFlags::ValueTypeDefaultFlags",0x80b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"TypeFlags::PrimitiveValueTypeDefaultFlags",0x96b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"TypeFlags::PrimitiveValueMetatypeDefaultFlags",0x11b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"TypeSlotFlags::None",0xb);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"TypeSlotFlags::VisibilityBits",0x2b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"TypeSlotFlags::VisibilityShift",0xb);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"TypeSlotFlags::VisibilityMask",0x3b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"TypeSlotFlags::Private",0xb);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"TypeSlotFlags::Protected",0x1b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"TypeSlotFlags::Internal",0x2b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"TypeSlotFlags::Public",0x3b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"TypeSlotFlags::ReadOnly",0x4b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"TypeSlotFlags::NoRTTIExcluded",0x8b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"TypeSlotFlags::MinRTTIExcluded",0x10b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"TypeSlotFlags::NoSourceDefinitionExcluded",0x20b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"TypeSlotFlags::Bytecode",0x40b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"TypeSlotFlags::DebugInformation",0x80b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"TypeSlotFlags::JitSpecific",0x100b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"TypeSlotFlags::TargetGenerated",0x200b);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"TypeSlotFlags::Cache",0x400b);
  return;
}

Assistant:

void sysbvm_type_setupPrimitives(sysbvm_context_t *context)
{
    context->roots.simpleFunctionTypeTemplate = sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "SimpleFunctionTypeTemplate", 4, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_MEMOIZED | SYSBVM_FUNCTION_FLAGS_TEMPLATE, NULL, sysbvm_type_primitive_createSimpleFunctionType);
    context->roots.sequenceTupleTypeTemplate = sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "SequenceTupleTypeTemplate", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_MEMOIZED | SYSBVM_FUNCTION_FLAGS_TEMPLATE, NULL, sysbvm_type_primitive_createSequenceTupleTemplate);
    context->roots.pointerTypeTemplate = sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "PointerTypeTemplate", 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_MEMOIZED | SYSBVM_FUNCTION_FLAGS_TEMPLATE, NULL, sysbvm_type_primitive_createPointerType);
    context->roots.referenceTypeTemplate = sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "ReferenceTypeTemplate", 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_MEMOIZED | SYSBVM_FUNCTION_FLAGS_TEMPLATE, NULL, sysbvm_type_primitive_createReferenceType);
    context->roots.temporaryReferenceTypeTemplate = sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "TemporaryReferenceTypeTemplate", 3, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_MEMOIZED | SYSBVM_FUNCTION_FLAGS_TEMPLATE, NULL, sysbvm_type_primitive_createTemporaryReferenceType);
    context->roots.pointerLikeLoadPrimitive = sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "PointerLikeType::load", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_TARGET_DEFINED_PRIMITIVE, NULL, sysbvm_type_primitive_pointerLikeLoad);
    context->roots.pointerLikeStorePrimitive = sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "PointerLikeType::store:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_TARGET_DEFINED_PRIMITIVE, NULL, sysbvm_type_primitive_pointerLikeStore);
    context->roots.pointerLikeElementAt = sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "PointerLikeType::at:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_TARGET_DEFINED_PRIMITIVE, NULL, sysbvm_type_primitive_pointerLikeTypeElementAt);
    context->roots.pointerLikeReinterpretCast = sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "PointerLikeType::reinterpretCast", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_TARGET_DEFINED_PRIMITIVE, NULL, sysbvm_type_primitive_pointerLikeTypeReinterpretCast);

    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "PointerType::reinterpretCastTo:", context->roots.anyPointerType, "reinterpretCastTo:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_type_primitive_pointerLikeTypeReinterpretCastTo);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "UIntPointer::reinterpretCastTo:", context->roots.uintptrType, "reinterpretCastTo:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_type_primitive_pointerLikeTypeReinterpretCastTo);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "IntPointer::reinterpretCastTo:", context->roots.intptrType, "reinterpretCastTo:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_type_primitive_pointerLikeTypeReinterpretCastTo);

    context->roots.anyValueToVoidPrimitive = sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "Void::fromAnyValue", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_NO_TYPECHECK_ARGUMENTS, NULL, sysbvm_void_primitive_anyValueToVoid);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, sysbvm_tuple_getType(context, context->roots.voidType), "coerceASTNode:withEnvironment:", 3, SYSBVM_FUNCTION_FLAGS_NONE, NULL, sysbvm_void_primitive_coerceASTNodeWithEnvironment);
    
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.typeType, "coerceASTNode:withEnvironment:", 3, SYSBVM_FUNCTION_FLAGS_NONE, NULL, sysbvm_type_primitive_coerceASTNodeWithEnvironment);

    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.typeType, "flushLookupSelector:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_type_primitive_flushLookupSelector);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.typeType, "flushMacroLookupSelector:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_type_primitive_flushMacroLookupSelector);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.typeType, "flushFallbackLookupSelector:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_type_primitive_flushFallbackLookupSelector);
    // Export the type flags.
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeFlags::None", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_NONE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeFlags::Nullable", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_NULLABLE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeFlags::Bytes", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_BYTES));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeFlags::Immediate", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_IMMEDIATE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeFlags::Weak", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_WEAK));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeFlags::Final", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_FINAL));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeFlags::Abstract", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_ABSTRACT));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeFlags::Dynamic", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_DYNAMIC));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeFlags::Value", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_VALUE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeFlags::FatPointerValue", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_FAT_POINTER_VALUE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeFlags::PointerValue", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_POINTER_VALUE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeFlags::ReferenceValue", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_REFERENCE_VALUE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeFlags::TemporaryReferenceValue", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_TEMPORARY_REFERENCE_VALUE));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeFlags::Function", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_FUNCTION));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeFlags::EmptyTrivialSingleton", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_EMPTY_TRIVIAL_SINGLETON));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeFlags::PointerLikeValue", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_POINTER_LIKE_VALUE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeFlags::ClassDefaultFlags", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_CLASS_DEFAULT_FLAGS));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeFlags::MetatypeRequiredFlags", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_METATYPE_REQUIRED_FLAGS));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeFlags::PointerTypeFlags", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_POINTER_TYPE_FLAGS));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeFlags::ReferenceTypeFlags", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_REFERENCE_TYPE_FLAGS));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeFlags::TemporaryReferenceTypeFlags", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_TEMPORARY_REFERENCE_TYPE_FLAGS));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeFlags::ValueTypeDefaultFlags", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_VALUE_TYPE_DEFAULT_FLAGS));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeFlags::PrimitiveValueTypeDefaultFlags", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_PRIMITIVE_VALUE_TYPE_DEFAULT_FLAGS));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeFlags::PrimitiveValueMetatypeDefaultFlags", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_PRIMITIVE_VALUE_TYPE_METATYPE_FLAGS));

    // Export the type slot flags.
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeSlotFlags::None", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_SLOT_FLAG_NONE));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeSlotFlags::VisibilityBits", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_SLOT_FLAG_VISIBILITY_BITS));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeSlotFlags::VisibilityShift", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_SLOT_FLAG_VISIBILITY_SHIFT));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeSlotFlags::VisibilityMask", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_SLOT_FLAG_VISIBILITY_MASK));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeSlotFlags::Private", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_SLOT_FLAG_PRIVATE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeSlotFlags::Protected", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_SLOT_FLAG_PROTECTED));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeSlotFlags::Internal", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_SLOT_FLAG_INTERNAL));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeSlotFlags::Public", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_SLOT_FLAG_PUBLIC));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeSlotFlags::ReadOnly", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_SLOT_FLAG_READONLY));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeSlotFlags::NoRTTIExcluded", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_SLOT_FLAG_NO_RTTI_EXCLUDED));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeSlotFlags::MinRTTIExcluded", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_SLOT_FLAG_MIN_RTTI_EXCLUDED));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeSlotFlags::NoSourceDefinitionExcluded", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_SLOT_FLAG_NO_SOURCE_DEFINITION_EXCLUDED));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeSlotFlags::Bytecode", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_SLOT_FLAG_BYTECODE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeSlotFlags::DebugInformation", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_SLOT_FLAG_DEBUG_INFORMATION));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeSlotFlags::JitSpecific", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_SLOT_FLAG_JIT_SPECIFIC));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeSlotFlags::TargetGenerated", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_SLOT_FLAG_TARGET_GENERATED));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "TypeSlotFlags::Cache", sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_SLOT_FLAG_CACHE));
}